

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult(secp256k1_gej *r,secp256k1_gej *a,secp256k1_scalar *na,secp256k1_scalar *ng)

{
  undefined1 local_850 [8];
  secp256k1_strauss_state state;
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  secp256k1_fe aux [8];
  secp256k1_scalar *ng_local;
  secp256k1_scalar *na_local;
  secp256k1_gej *a_local;
  secp256k1_gej *r_local;
  
  local_850 = (undefined1  [8])&pre_a[7].infinity;
  state.aux = (secp256k1_fe *)&ps[0].bits_na_1;
  state.pre_a = (secp256k1_ge *)&state.ps;
  secp256k1_ecmult_strauss_wnaf((secp256k1_strauss_state *)local_850,r,1,a,na,ng);
  return;
}

Assistant:

static void secp256k1_ecmult(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_fe aux[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
    struct secp256k1_strauss_state state;

    state.aux = aux;
    state.pre_a = pre_a;
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(&state, r, 1, a, na, ng);
}